

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

void __thiscall
Sudoku::addDependenciesFields
          (Sudoku *this,
          vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *fields)

{
  long lVar1;
  int iVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  Field *pFVar7;
  pointer psVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  undefined1 *puVar19;
  int local_bc;
  shared_ptr<Field> local_98;
  shared_ptr<Field> local_88;
  shared_ptr<Field> local_78;
  shared_ptr<Field> local_68;
  shared_ptr<Field> local_58;
  shared_ptr<Field> local_48;
  long local_38;
  
  if (this->size_ != 0) {
    if (0 < this->squared_size_) {
      iVar14 = 0;
      uVar10 = 0;
      do {
        if (0 < this->squared_size_) {
          uVar17 = 0;
          do {
            iVar11 = (int)uVar17;
            if (0 < this->size_) {
              iVar2 = 0;
              local_bc = 0;
              do {
                iVar13 = this->size_;
                if (0 < iVar13) {
                  iVar18 = 0;
                  do {
                    if ((iVar13 != 3) || (this->type_ != freeform)) {
                      uVar15 = (uVar10 - (int)uVar10 % iVar13) + local_bc;
                      iVar13 = iVar18 - iVar11 % iVar13;
                      if ((uVar15 != uVar10) || (iVar13 != 0)) {
                        iVar9 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar10,uVar17);
                        pFVar7 = (fields->
                                 super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[iVar9].
                                 super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                        iVar13 = (*this->_vptr_Sudoku[7])
                                           (this,(ulong)uVar15,(ulong)(uint)(iVar13 + iVar11));
                        psVar8 = (this->fields_).
                                 super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        local_48.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             psVar8[iVar13].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                        local_48.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi = psVar8[iVar13].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
                        if (local_48.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                           ) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            (local_48.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count =
                                 (local_48.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            (local_48.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count =
                                 (local_48.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                          }
                        }
                        Field::addDependency(pFVar7,&local_48);
                        if (local_48.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                           ) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_48.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi);
                        }
                      }
                    }
                    uVar15 = this->size_ * local_bc + iVar18;
                    if (uVar15 + iVar14 != 0) {
                      iVar13 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar10,uVar17);
                      pFVar7 = (fields->
                               super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[iVar13].
                               super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                      iVar13 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar15,uVar17);
                      psVar8 = (this->fields_).
                               super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      local_58.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                           psVar8[iVar13].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                      local_58.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi = psVar8[iVar13].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                      if (local_58.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          (local_58.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count =
                               (local_58.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          (local_58.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count =
                               (local_58.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                        }
                      }
                      Field::addDependency(pFVar7,&local_58);
                      if (local_58.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  (local_58.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
                      }
                    }
                    iVar13 = this->size_;
                    if (iVar2 * iVar13 + iVar11 != iVar18) {
                      iVar9 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar10,uVar17);
                      pFVar7 = (fields->
                               super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[iVar9].
                               super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                      iVar13 = (*this->_vptr_Sudoku[7])
                                         (this,(ulong)uVar10,
                                          (ulong)(uint)(iVar13 * local_bc + iVar18));
                      psVar8 = (this->fields_).
                               super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      local_68.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                           psVar8[iVar13].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                      local_68.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi = psVar8[iVar13].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                      if (local_68.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          (local_68.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count =
                               (local_68.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          (local_68.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count =
                               (local_68.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                        }
                      }
                      Field::addDependency(pFVar7,&local_68);
                      if (local_68.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  (local_68.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
                      }
                    }
                    iVar18 = iVar18 + 1;
                    iVar13 = this->size_;
                  } while (iVar18 < iVar13);
                }
                local_bc = local_bc + 1;
                iVar2 = iVar2 + -1;
              } while (local_bc < this->size_);
            }
            uVar17 = (ulong)(iVar11 + 1U);
          } while ((int)(iVar11 + 1U) < this->squared_size_);
        }
        uVar10 = uVar10 + 1;
        iVar14 = iVar14 + -1;
      } while ((int)uVar10 < this->squared_size_);
    }
    if ((this->type_ == diagonal) && (0 < this->squared_size_)) {
      uVar10 = 0;
      do {
        if (0 < this->squared_size_) {
          uVar17 = 0;
          iVar14 = -1;
          do {
            if (uVar10 != (uint)uVar17) {
              iVar11 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar10,(ulong)uVar10);
              pFVar7 = (fields->
                       super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[iVar11].
                       super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              iVar11 = (*this->_vptr_Sudoku[7])(this,uVar17,uVar17);
              psVar8 = (this->fields_).
                       super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   psVar8[iVar11].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   psVar8[iVar11].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              if (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                  ->_M_use_count =
                       (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                  ->_M_use_count =
                       (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
                }
              }
              Field::addDependency(pFVar7,&local_78);
              if (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              iVar11 = (*this->_vptr_Sudoku[7])
                                 (this,(ulong)uVar10,(ulong)(this->squared_size_ + ~uVar10));
              pFVar7 = (fields->
                       super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[iVar11].
                       super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              iVar11 = (*this->_vptr_Sudoku[7])
                                 (this,uVar17,(ulong)(uint)(this->squared_size_ + iVar14));
              psVar8 = (this->fields_).
                       super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_88.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   psVar8[iVar11].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_88.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   psVar8[iVar11].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              if (local_88.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_88.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                  ->_M_use_count =
                       (local_88.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_88.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                  ->_M_use_count =
                       (local_88.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
                }
              }
              Field::addDependency(pFVar7,&local_88);
              if (local_88.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_88.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            uVar15 = (uint)uVar17 + 1;
            uVar17 = (ulong)uVar15;
            iVar14 = iVar14 + -1;
          } while ((int)uVar15 < this->squared_size_);
        }
        uVar10 = uVar10 + 1;
      } while ((int)uVar10 < this->squared_size_);
    }
    if ((this->type_ == freeform) && (this->size_ == 3)) {
      puVar19 = &DAT_00122101;
      local_38 = 0;
      do {
        lVar1 = local_38 * 0x12;
        lVar12 = 0;
        do {
          cVar3 = (&DAT_00122100)[lVar12 * 2 + lVar1];
          cVar4 = (&DAT_00122101)[lVar12 * 2 + lVar1];
          lVar16 = 0;
          do {
            cVar5 = puVar19[lVar16 * 2 + -1];
            cVar6 = puVar19[lVar16 * 2];
            if ((cVar5 != cVar3) || (cVar6 != cVar4)) {
              iVar14 = (*this->_vptr_Sudoku[7])
                                 (this,(ulong)(uint)(int)cVar3,(ulong)(uint)(int)cVar4);
              pFVar7 = (fields->
                       super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[iVar14].
                       super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              iVar14 = (*this->_vptr_Sudoku[7])
                                 (this,(ulong)(uint)(int)cVar5,(ulong)(uint)(int)cVar6);
              psVar8 = (this->fields_).
                       super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_98.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   psVar8[iVar14].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_98.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   psVar8[iVar14].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              if (local_98.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_98.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                  ->_M_use_count =
                       (local_98.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_98.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                  ->_M_use_count =
                       (local_98.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
                }
              }
              Field::addDependency(pFVar7,&local_98);
              if (local_98.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_98.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 9);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 9);
        local_38 = local_38 + 1;
        puVar19 = puVar19 + 0x12;
      } while (local_38 != 9);
    }
  }
  return;
}

Assistant:

void Sudoku::addDependenciesFields(std::vector<std::shared_ptr<Field>> &fields)
{
  if(size_ == 0)
    return;

  //add dependencies
  // loop over all fields
  for(int x = 0; x < squared_size_; x++)    // x,y: global index of field for which dependencies are added
  {
    for (int y = 0; y < squared_size_; y++)
    {
      // loop over all fields in same block3x3
      for (int field3x3_x = 0; field3x3_x < size_; field3x3_x++)  // field3x3_x, field3x3_y: local index in own block3x3
      {
        for (int field3x3_y = 0; field3x3_y < size_; field3x3_y++)
        {

          int block3x3_no_x = int(x / size_);     // own index of block3x3
          int block3x3_no_y = int(y / size_);

          //add dependencies to all of 3x3 block
          if(type_ != SudokuType::freeform || size_ != 3)
          {
            int dependency_x = block3x3_no_x*size_ + field3x3_x;
            int dependency_y = block3x3_no_y*size_ + field3x3_y;

            if(dependency_x != x || dependency_y != y)
              fields[index(x,y)]->addDependency(fields_[index(dependency_x,dependency_y)]);
          }

          //add dependencies to all of row
          int dependency_x = field3x3_x*size_ + field3x3_y;   // this is actually an own loop over x=0..squared_size
          int dependency_y = y;

          if(dependency_x != x || dependency_y != y)
            fields[index(x,y)]->addDependency(fields_[index(dependency_x,dependency_y)]);

          //add dependencies to all of column
          dependency_x = x;
          dependency_y = field3x3_x*size_ + field3x3_y; // this is actually an own loop over y=0..squared_size

          if(dependency_x != x || dependency_y != y)
            fields[index(x,y)]->addDependency(fields_[index(dependency_x,dependency_y)]);
        }
      }
    }
  }

  // add diagonal dependencies
  if(type_ == SudokuType::diagonal)
  {
    for(int i = 0; i < squared_size_; i++)
    {
      for(int j = 0; j < squared_size_; j++)
      {
        // diagonal lower left to upper right
        if(i != j)
          fields[index(i,i)]->addDependency(fields_[index(j,j)]);

        // diagonal upper left to lower right
        if(i != j)
          fields[index(i,squared_size_-1-i)]->addDependency(fields_[index(j,squared_size_-1-j)]);
      }
    }
  }

  // add block dependencies for freeform
  if(type_ == SudokuType::freeform && size_ == 3)
  {
    // center block
    char block[][9][2] = {
      {{3,3}, {4,3}, {5,3}, {3,4}, {4,4}, {5,4}, {3,5}, {4,5}, {5,5}},    // center block
      {{0,0}, {1,0}, {3,2}, {0,1}, {1,1}, {2,1}, {2,3}, {1,2}, {2,2}},    // lower left block
      {{3,0}, {4,0}, {5,0}, {3,1}, {4,1}, {5,1}, {2,0}, {4,2}, {6,0}},    // bottom block
      {{5,2}, {7,0}, {8,0}, {6,1}, {7,1}, {8,1}, {6,2}, {7,2}, {6,3}},    // lower right block
      {{8,2}, {7,3}, {8,3}, {6,4}, {7,4}, {8,4}, {8,6}, {7,5}, {8,5}},    // right block
      {{6,6}, {7,6}, {6,5}, {6,7}, {7,7}, {8,7}, {5,6}, {7,8}, {8,8}},    // upper right block
      {{2,8}, {4,6}, {6,8}, {3,7}, {4,7}, {5,7}, {3,8}, {4,8}, {5,8}},    // top block
      {{2,5}, {1,6}, {2,6}, {0,7}, {1,7}, {2,7}, {0,8}, {1,8}, {3,6}},    // upper left block
      {{0,3}, {1,3}, {0,2}, {0,4}, {1,4}, {2,4}, {0,5}, {1,5}, {0,6}}};   // left block

    for(int block_no = 0; block_no < 9; block_no++)
    {
      for(int i = 0; i < 9; i++)
      {
        int x = block[block_no][i][0];
        int y = block[block_no][i][1];

        for(int j = 0; j < 9; j++)
        {
          int dependency_x = block[block_no][j][0];
          int dependency_y = block[block_no][j][1];

          if(dependency_x != x || dependency_y != y)
          {
            fields[index(x,y)]->addDependency(fields_[index(dependency_x,dependency_y)]);
          }
        }
      }
    }
  }

}